

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glyphs.h
# Opt level: O3

void __thiscall rengine::GlyphContext::GlyphContext(GlyphContext *this,string *fontFile)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  char cVar4;
  int iVar5;
  uchar *puVar6;
  long lVar7;
  size_t sVar8;
  ostream *poVar9;
  char local_260 [8];
  ifstream file;
  char local_58 [8];
  char buffer [16];
  long local_40;
  undefined1 local_38 [16];
  
  this->m_fontData = (uchar *)0x0;
  std::ifstream::ifstream(local_260,(string *)fontFile,_S_in|_S_bin|_S_ate);
  cVar4 = std::__basic_file<char>::is_open();
  if (cVar4 == '\0') {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"E [",3);
    lVar7 = std::chrono::_V2::system_clock::now();
    auVar1 = SEXT816(lVar7 / 1000000000) * SEXT816(0x346dc5d63886594b);
    auVar2 = SEXT816(lVar7 / 1000000) * SEXT816(0x20c49ba5e353f7cf);
    auVar3 = SEXT816(lVar7 / 1000) * SEXT816(0x20c49ba5e353f7cf);
    snprintf(local_58,0x10,"%4d.%03d %03d",
             (ulong)(uint)((int)(lVar7 / 1000000000) +
                          ((int)(auVar1._8_8_ >> 0xb) - (auVar1._12_4_ >> 0x1f)) * -10000),
             (ulong)(uint)((int)(lVar7 / 1000000) +
                          ((int)(auVar2._8_8_ >> 7) - (auVar2._12_4_ >> 0x1f)) * -1000),
             (ulong)(uint)((int)(lVar7 / 1000) +
                          ((int)(auVar3._8_8_ >> 7) - (auVar3._12_4_ >> 0x1f)) * -1000));
    buffer._8_8_ = local_38;
    sVar8 = strlen(local_58);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)(buffer + 8),local_58,local_58 + sVar8);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(char *)buffer._8_8_,local_40);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"]: ",3);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"rengine::GlyphContext::GlyphContext(const std::string &)",0x38);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,": ",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"Failed to open font file \'",0x1a);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,(fontFile->_M_dataplus)._M_p,fontFile->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\'",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
  }
  else {
    iVar5 = std::istream::tellg();
    puVar6 = (uchar *)malloc((long)iVar5);
    this->m_fontData = puVar6;
    if (puVar6 != (uchar *)0x0) {
      std::istream::seekg((long)local_260,_S_beg);
      std::istream::read(local_260,(long)this->m_fontData);
      std::ifstream::close();
      iVar5 = stbtt_InitFont(&this->m_fontInfo,this->m_fontData,0);
      if (iVar5 == 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"E [",3);
        lVar7 = std::chrono::_V2::system_clock::now();
        auVar1 = SEXT816(lVar7 / 1000000000) * SEXT816(0x346dc5d63886594b);
        auVar2 = SEXT816(lVar7 / 1000000) * SEXT816(0x20c49ba5e353f7cf);
        auVar3 = SEXT816(lVar7 / 1000) * SEXT816(0x20c49ba5e353f7cf);
        snprintf(local_58,0x10,"%4d.%03d %03d",
                 (ulong)(uint)((int)(lVar7 / 1000000000) +
                              ((int)(auVar1._8_8_ >> 0xb) - (auVar1._12_4_ >> 0x1f)) * -10000),
                 (ulong)(uint)((int)(lVar7 / 1000000) +
                              ((int)(auVar2._8_8_ >> 7) - (auVar2._12_4_ >> 0x1f)) * -1000),
                 (ulong)(uint)((int)(lVar7 / 1000) +
                              ((int)(auVar3._8_8_ >> 7) - (auVar3._12_4_ >> 0x1f)) * -1000));
        buffer._8_8_ = local_38;
        sVar8 = strlen(local_58);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)(buffer + 8),local_58,local_58 + sVar8);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,(char *)buffer._8_8_,local_40);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"]: ",3);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar9,"rengine::GlyphContext::GlyphContext(const std::string &)",0x38);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,": ",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar9,"Failed to initialize font \'",0x1b);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar9,(fontFile->_M_dataplus)._M_p,fontFile->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\'",1);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
        std::ostream::put((char)poVar9);
        std::ostream::flush();
        if ((undefined1 *)buffer._8_8_ != local_38) {
          operator_delete((void *)buffer._8_8_);
        }
        free(this->m_fontData);
        this->m_fontData = (uchar *)0x0;
      }
      goto LAB_00133d5a;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"E [",3);
    lVar7 = std::chrono::_V2::system_clock::now();
    auVar1 = SEXT816(lVar7 / 1000000000) * SEXT816(0x346dc5d63886594b);
    auVar2 = SEXT816(lVar7 / 1000000) * SEXT816(0x20c49ba5e353f7cf);
    auVar3 = SEXT816(lVar7 / 1000) * SEXT816(0x20c49ba5e353f7cf);
    snprintf(local_58,0x10,"%4d.%03d %03d",
             (ulong)(uint)((int)(lVar7 / 1000000000) +
                          ((int)(auVar1._8_8_ >> 0xb) - (auVar1._12_4_ >> 0x1f)) * -10000),
             (ulong)(uint)((int)(lVar7 / 1000000) +
                          ((int)(auVar2._8_8_ >> 7) - (auVar2._12_4_ >> 0x1f)) * -1000),
             (ulong)(uint)((int)(lVar7 / 1000) +
                          ((int)(auVar3._8_8_ >> 7) - (auVar3._12_4_ >> 0x1f)) * -1000));
    buffer._8_8_ = local_38;
    sVar8 = strlen(local_58);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)(buffer + 8),local_58,local_58 + sVar8);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(char *)buffer._8_8_,local_40);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"]: ",3);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"rengine::GlyphContext::GlyphContext(const std::string &)",0x38);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,": ",2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"Failed to allocate font data for \'",0x22);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,(fontFile->_M_dataplus)._M_p,fontFile->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\'",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
  }
  if ((undefined1 *)buffer._8_8_ != local_38) {
    operator_delete((void *)buffer._8_8_);
  }
LAB_00133d5a:
  std::ifstream::~ifstream(local_260);
  return;
}

Assistant:

inline GlyphContext::GlyphContext(const std::string &fontFile)
{
    std::ifstream file(fontFile, std::ios::binary | std::ios::in | std::ios::ate);
    if (!file.is_open()) {
        loge << "Failed to open font file '" << fontFile << "'" << std::endl;
        return;
    }

    int size = file.tellg();

    m_fontData = (unsigned char *) malloc(size);
    if (!m_fontData) {
        loge << "Failed to allocate font data for '" << fontFile << "'" << std::endl;
        return;
    }

    file.seekg(0, std::ios::beg);
    file.read((char *) m_fontData, size);
    file.close();

    if (!stbtt_InitFont(&m_fontInfo, m_fontData, 0)) {
        loge << "Failed to initialize font '" << fontFile << "'" << std::endl;
        free(m_fontData);
        m_fontData = 0;
        return;
    }
}